

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_78::BinaryReaderIR::BeginElemSegment
          (BinaryReaderIR *this,Index index,Index table_index,uint8_t flags)

{
  char *pcVar1;
  Offset OVar2;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 aVar3;
  uint uVar4;
  size_t sVar5;
  tuple<wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_> tVar6;
  Location loc;
  __uniq_ptr_impl<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
  local_a0;
  Location local_98;
  Var local_78;
  
  pcVar1 = this->filename_;
  OVar2 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  sVar5 = strlen(pcVar1);
  tVar6.
  super__Tuple_impl<0UL,_wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>
  .super__Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>
        )operator_new(0xe8);
  *(long *)((long)tVar6.
                  super__Tuple_impl<0UL,_wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>
                  .super__Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false>._M_head_impl + 8) =
       0;
  *(long *)((long)tVar6.
                  super__Tuple_impl<0UL,_wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>
                  .super__Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false>._M_head_impl + 0x10)
       = 0;
  *(char **)((long)tVar6.
                   super__Tuple_impl<0UL,_wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>
                   .super__Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false>._M_head_impl + 0x18
            ) = pcVar1;
  *(size_t *)
   ((long)tVar6.
          super__Tuple_impl<0UL,_wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>
          .super__Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false>._M_head_impl + 0x20) = sVar5
  ;
  *(Offset *)
   ((long)tVar6.
          super__Tuple_impl<0UL,_wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>
          .super__Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false>._M_head_impl + 0x28) = OVar2
  ;
  *(undefined4 *)
   ((long)tVar6.
          super__Tuple_impl<0UL,_wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>
          .super__Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false>._M_head_impl + 0x30) = 0;
  *(undefined4 *)
   ((long)tVar6.
          super__Tuple_impl<0UL,_wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>
          .super__Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false>._M_head_impl + 0x38) = 6;
  *(undefined ***)
   tVar6.
   super__Tuple_impl<0UL,_wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>
   .super__Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false>._M_head_impl =
       &PTR__ElemSegmentModuleField_001e8e70;
  ElemSegment::ElemSegment
            ((ElemSegment *)
             ((long)tVar6.
                    super__Tuple_impl<0UL,_wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>
                    .super__Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false>._M_head_impl +
             0x40),(string_view)ZEXT816(0));
  pcVar1 = this->filename_;
  aVar3.offset = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  local_98.field_1.field_0.last_column = 0;
  local_98.filename.size_ = strlen(pcVar1);
  local_98.filename.data_ = pcVar1;
  local_98.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)aVar3.offset;
  Var::Var(&local_78,table_index,&local_98);
  Var::operator=((Var *)((long)tVar6.
                               super__Tuple_impl<0UL,_wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>
                               .super__Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false>.
                               _M_head_impl + 0x68),&local_78);
  Var::~Var(&local_78);
  uVar4 = 2;
  if ((~flags & 3) != 0) {
    uVar4 = flags & 1;
  }
  *(uint *)((long)tVar6.
                  super__Tuple_impl<0UL,_wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>
                  .super__Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false>._M_head_impl + 0x40)
       = uVar4;
  local_a0._M_t.
  super__Tuple_impl<0UL,_wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>
  .super__Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false>._M_head_impl =
       (tuple<wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>)
       (tuple<wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>)
       tVar6.
       super__Tuple_impl<0UL,_wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>
       .super__Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false>._M_head_impl;
  Module::AppendField(this->module_,
                      (unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
                       *)&local_a0);
  if ((_Tuple_impl<0UL,_wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>
       )local_a0._M_t.
        super__Tuple_impl<0UL,_wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>
        .super__Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false>._M_head_impl !=
      (ElemSegmentModuleField *)0x0) {
    (**(code **)(*(long *)local_a0._M_t.
                          super__Tuple_impl<0UL,_wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>
                          .super__Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false>._M_head_impl
                + 8))();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::BeginElemSegment(Index index,
                                        Index table_index,
                                        uint8_t flags) {
  auto field = MakeUnique<ElemSegmentModuleField>(GetLocation());
  ElemSegment& elem_segment = field->elem_segment;
  elem_segment.table_var = Var(table_index, GetLocation());
  if ((flags & SegDeclared) == SegDeclared) {
    elem_segment.kind = SegmentKind::Declared;
  } else if ((flags & SegPassive) == SegPassive) {
    elem_segment.kind = SegmentKind::Passive;
  } else {
    elem_segment.kind = SegmentKind::Active;
  }
  module_->AppendField(std::move(field));
  return Result::Ok;
}